

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra.cc
# Opt level: O2

string * format_system_error_abi_cxx11_
                   (string *__return_storage_ptr__,int error_code,string_view message)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf;
  undefined4 in_register_00000034;
  size_t in_R8;
  string_view message_00;
  memory_buffer out;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_228;
  
  message_00.data_ = (char *)message.size_;
  local_228.super_basic_buffer<char>.ptr_ = local_228.store_;
  local_228.super_basic_buffer<char>.size_ = 0;
  local_228.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_001d5f50;
  local_228.super_basic_buffer<char>.capacity_ = 500;
  message_00.size_ = in_R8;
  fmt::v5::format_system_error
            ((v5 *)&local_228,(buffer *)CONCAT44(in_register_00000034,error_code),(int)message.data_
             ,message_00);
  fmt::v5::to_string<char,500ul>(__return_storage_ptr__,(v5 *)&local_228,buf);
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&local_228)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string format_system_error(int error_code, fmt::string_view message) {
  fmt::memory_buffer out;
  format_system_error(out, error_code, message);
  return to_string(out);
}